

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O0

object_ptr __thiscall
mjs::anon_unknown_63::array_map
          (anon_unknown_63 *this,gc_heap_ptr<mjs::global_object> *global,value *this_,
          vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  vector<mjs::value,_std::allocator<mjs::value>_> *args_00;
  vector<mjs::value,_std::allocator<mjs::value>_> *this__00;
  undefined8 extraout_RDX;
  object_ptr oVar1;
  anon_class_8_1_54a39801 local_70;
  anon_class_24_2_d5e5c3d9 local_68;
  gc_heap_ptr<mjs::global_object> local_40;
  undefined1 local_29;
  vector<mjs::value,_std::allocator<mjs::value>_> *local_28;
  vector<mjs::value,_std::allocator<mjs::value>_> *args_local;
  value *this__local;
  gc_heap_ptr<mjs::global_object> *global_local;
  object_ptr *a;
  
  local_29 = 0;
  local_28 = args;
  args_local = (vector<mjs::value,_std::allocator<mjs::value>_> *)this_;
  this__local = (value *)global;
  global_local = (gc_heap_ptr<mjs::global_object> *)this;
  gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)this);
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr
            (&local_40,(gc_heap_ptr<mjs::global_object> *)this__local);
  this__00 = args_local;
  args_00 = local_28;
  local_68.a = (object_ptr *)this;
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr
            (&local_68.global,(gc_heap_ptr<mjs::global_object> *)this__local);
  local_70.a = (object_ptr *)this;
  (anonymous_namespace)::
  for_each_helper<mjs::(anonymous_namespace)::array_map(mjs::gc_heap_ptr<mjs::global_object>const&,mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)::__0,mjs::(anonymous_namespace)::array_map(mjs::gc_heap_ptr<mjs::global_object>const&,mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)::__1>
            (&local_40,(value *)this__00,args_00,&local_68,&local_70);
  (anonymous_namespace)::
  array_map(mjs::gc_heap_ptr<mjs::global_object>const&,mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)
  ::$_0::~__0((__0 *)&local_68);
  gc_heap_ptr<mjs::global_object>::~gc_heap_ptr(&local_40);
  oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr array_map(const gc_heap_ptr<global_object>& global, const value& this_, const std::vector<value>& args) {
    object_ptr a;
    for_each_helper(global, this_, args, [&a, global](uint32_t length) {
        a = make_array(global, length);
    }, [&a](uint32_t k, const value& v) {
        a->put(string{a.heap(), index_string(k)}, v);
        return true;
    });
    return a;
}